

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

realtype N_VL1Norm_SensWrapper(N_Vector x)

{
  realtype rVar1;
  realtype tmp;
  realtype nrm;
  int i;
  N_Vector x_local;
  
  tmp = 0.0;
  for (nrm._4_4_ = 0; nrm._4_4_ < *(int *)((long)x->content + 8); nrm._4_4_ = nrm._4_4_ + 1) {
    rVar1 = N_VL1Norm(*(N_Vector *)(*x->content + (long)nrm._4_4_ * 8));
    if (tmp < rVar1) {
      tmp = rVar1;
    }
  }
  return tmp;
}

Assistant:

realtype N_VL1Norm_SensWrapper(N_Vector x)
{
  int i;
  realtype nrm, tmp;

  nrm = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VL1Norm(NV_VEC_SW(x,i));
    if (tmp > nrm) nrm = tmp;
  }

  return(nrm);
}